

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_logger.c
# Opt level: O2

void default_logfn(pcp_loglvl_e mode,char *msg)

{
  ulong uVar1;
  char *pcVar2;
  timeval cur_timestamp;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  if (default_logfn::prev_timestamp.tv_sec == 0 && default_logfn::prev_timestamp.tv_usec == 0) {
    default_logfn::prev_timestamp.tv_usec = local_20.tv_usec;
    default_logfn::prev_timestamp.tv_sec = local_20.tv_sec;
    uVar1 = 0;
  }
  else {
    uVar1 = (local_20.tv_usec - default_logfn::prev_timestamp.tv_usec) +
            (local_20.tv_sec - default_logfn::prev_timestamp.tv_sec) * 1000000;
  }
  if (mode - PCP_LOGLVL_ERR < 5) {
    pcVar2 = &DAT_00109db4 + *(int *)(&DAT_00109db4 + (ulong)(mode - PCP_LOGLVL_ERR) * 4);
  }
  else {
    pcVar2 = "UNKNOWN";
  }
  fprintf(_stderr,"%3llus %03llums %03lluus %-7s: %s\n",(long)uVar1 / 1000000,
          (uVar1 % 1000000) / 1000,(long)uVar1 % 1000,pcVar2,msg);
  return;
}

Assistant:

static void default_logfn(pcp_loglvl_e mode, const char *msg) {

    const char *prefix;
    static struct timeval prev_timestamp = {0, 0};
    struct timeval cur_timestamp;
    uint64_t diff;

    gettimeofday(&cur_timestamp, NULL);

    if ((prev_timestamp.tv_sec == 0) && (prev_timestamp.tv_usec == 0)) {
        prev_timestamp = cur_timestamp;
        diff = 0;
    } else {
        diff = (cur_timestamp.tv_sec - prev_timestamp.tv_sec) * 1000000 +
               (cur_timestamp.tv_usec - prev_timestamp.tv_usec);
    }

    switch (mode) {
    case PCP_LOGLVL_ERR:
    case PCP_LOGLVL_PERR:
        prefix = "ERROR";
        break;
    case PCP_LOGLVL_WARN:
        prefix = "WARNING";
        break;
    case PCP_LOGLVL_INFO:
        prefix = "INFO";
        break;
    case PCP_LOGLVL_DEBUG:
        prefix = "DEBUG";
        break;
    default:
        prefix = "UNKNOWN";
        break;
    }

    fprintf(stderr, "%3llus %03llums %03lluus %-7s: %s\n",
            (long long int)diff / 1000000,
            (long long int)(diff % 1000000) / 1000, (long long int)diff % 1000,
            prefix, msg);
}